

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O1

parasail_result_t * parasail_result_new_rowcol3(int a,int b)

{
  parasail_result_t *ppVar1;
  parasail_result_extra_trace_t *ppVar2;
  undefined8 *puVar3;
  void *pvVar4;
  size_t _size;
  size_t __size;
  
  if ((a < 1) || (b < 1)) {
    parasail_result_new_rowcol3_cold_3();
  }
  else {
    ppVar1 = parasail_result_new();
    if (ppVar1 != (parasail_result_t *)0x0) {
      ppVar2 = (parasail_result_extra_trace_t *)malloc(0x18);
      (ppVar1->field_4).trace = ppVar2;
      if (ppVar2 == (parasail_result_extra_trace_t *)0x0) {
        parasail_result_new_rowcol3_cold_2();
      }
      else {
        puVar3 = (undefined8 *)malloc(0x40);
        ppVar2->trace_del_table = puVar3;
        if (puVar3 != (undefined8 *)0x0) {
          __size = (ulong)(uint)b << 2;
          pvVar4 = malloc(__size);
          *puVar3 = pvVar4;
          if (pvVar4 != (void *)0x0) {
            pvVar4 = malloc(__size);
            puVar3[1] = pvVar4;
            if (pvVar4 != (void *)0x0) {
              pvVar4 = malloc(__size);
              puVar3[2] = pvVar4;
              if (pvVar4 != (void *)0x0) {
                pvVar4 = malloc(__size);
                puVar3[3] = pvVar4;
                if (pvVar4 != (void *)0x0) {
                  __size = (ulong)(uint)a << 2;
                  pvVar4 = malloc(__size);
                  puVar3[4] = pvVar4;
                  if (pvVar4 != (void *)0x0) {
                    pvVar4 = malloc(__size);
                    puVar3[5] = pvVar4;
                    if (pvVar4 != (void *)0x0) {
                      pvVar4 = malloc(__size);
                      puVar3[6] = pvVar4;
                      if (pvVar4 != (void *)0x0) {
                        pvVar4 = malloc(__size);
                        puVar3[7] = pvVar4;
                        if (pvVar4 != (void *)0x0) {
                          return ppVar1;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_result_new_rowcol3",__size);
          return (parasail_result_t *)0x0;
        }
        parasail_result_new_rowcol3_cold_1();
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* parasail_result_new_rowcol3(const int a, const int b)
{
    /* declare all variables */
    parasail_result_t *result = NULL;

    VALIDATE_A_B
    
    /* allocate struct to hold memory */
    result = parasail_result_new();
    if (!result) return NULL;
    
    PARASAIL_NEW(result->stats, parasail_result_extra_stats_t);
    PARASAIL_NEW(result->stats->rowcols, parasail_result_extra_stats_rowcols_t);
    PARASAIL_CALLOC(result->stats->rowcols->score_row, int, b);
    PARASAIL_CALLOC(result->stats->rowcols->matches_row, int, b);
    PARASAIL_CALLOC(result->stats->rowcols->similar_row, int, b);
    PARASAIL_CALLOC(result->stats->rowcols->length_row, int, b);

    PARASAIL_CALLOC(result->stats->rowcols->score_col, int, a);
    PARASAIL_CALLOC(result->stats->rowcols->matches_col, int, a);
    PARASAIL_CALLOC(result->stats->rowcols->similar_col, int, a);
    PARASAIL_CALLOC(result->stats->rowcols->length_col, int, a);

    return result;
}